

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

dw_border_tile place(dw_map *map,dw_warp_index warp_idx,dw_tile tile,int lm_one,int lm_two)

{
  dw_tile tile_00;
  dw_border_tile dVar1;
  dw_warp *pdVar2;
  bool bVar3;
  dw_tile old_tile;
  dw_warp *warp;
  int local_20;
  uint8_t y;
  int iStack_1c;
  uint8_t x;
  int lm_two_local;
  int lm_one_local;
  dw_tile tile_local;
  dw_warp_index warp_idx_local;
  dw_map *map_local;
  
  pdVar2 = map->warps_from + warp_idx;
  local_20 = lm_two;
  iStack_1c = lm_one;
  lm_two_local = tile;
  lm_one_local = warp_idx;
  _tile_local = map;
  do {
    map_find_land(_tile_local,iStack_1c,local_20,(uint8_t *)((long)&warp + 7),
                  (uint8_t *)((long)&warp + 6),FALSE);
    tile_00 = (dw_tile)_tile_local->tiles[warp._7_1_][warp._6_1_];
    bVar3 = true;
    if ((tile_00 != TILE_CASTLE) && (bVar3 = true, tile_00 != TILE_TOWN)) {
      bVar3 = tile_00 == TILE_CAVE;
    }
  } while (bVar3);
  pdVar2->map = '\x01';
  pdVar2->x = warp._7_1_;
  pdVar2->y = warp._6_1_;
  _tile_local->tiles[warp._7_1_][warp._6_1_] = (uint8_t)lm_two_local;
  dVar1 = border_for(tile_00);
  return dVar1;
}

Assistant:

static dw_border_tile place(dw_map *map, dw_warp_index warp_idx, dw_tile tile,
        int lm_one, int lm_two)
{
    uint8_t x, y;
    dw_warp *warp;
    dw_tile old_tile;

    warp = &map->warps_from[warp_idx];

    do {
        map_find_land(map, lm_one, lm_two, &x, &y, FALSE);
        old_tile = map->tiles[x][y];
    } while (old_tile == TILE_CASTLE || old_tile == TILE_TOWN ||
             old_tile == TILE_CAVE);

    warp->map = 1;
    warp->x = x;
    warp->y = y;
    map->tiles[x][y] = tile;
    return border_for(old_tile);
}